

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

void mpz_mul_2exp(__mpz_struct *r,__mpz_struct *u,mp_bitcnt_t bits)

{
  uint uVar1;
  mp_srcptr up;
  uint uVar2;
  int iVar3;
  mp_ptr __s;
  mp_limb_t mVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  long size;
  
  uVar1 = u->_mp_size;
  uVar6 = -uVar1;
  uVar2 = uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar6;
  }
  if (uVar1 == 0) {
    iVar3 = 0;
  }
  else {
    uVar5 = bits >> 6;
    size = ((bits & 0x3f) != 0) + uVar5 + (ulong)uVar2;
    if (r->_mp_alloc < size) {
      __s = mpz_realloc(r,size);
    }
    else {
      __s = r->_mp_d;
    }
    up = u->_mp_d;
    if ((bits & 0x3f) == 0) {
      if (uVar1 != uVar6 && SBORROW4(uVar1,uVar6) == (int)(uVar1 * 2) < 0) {
        uVar6 = uVar1;
      }
      lVar7 = (ulong)uVar6 + 1;
      do {
        (__s + uVar5)[lVar7 + -2] = up[lVar7 + -2];
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    else {
      mVar4 = mpn_lshift(__s + uVar5,up,(ulong)uVar2,(uint)bits & 0x3f);
      __s[size + -1] = mVar4;
      size = size - (ulong)(mVar4 == 0);
    }
    if (0x3f < bits) {
      memset(__s,0,uVar5 << 3);
    }
    iVar3 = -(int)size;
    if (-1 < u->_mp_size) {
      iVar3 = (int)size;
    }
  }
  r->_mp_size = iVar3;
  return;
}

Assistant:

void
mpz_mul_2exp (mpz_t r, const mpz_t u, mp_bitcnt_t bits)
{
  mp_size_t un, rn;
  mp_size_t limbs;
  unsigned shift;
  mp_ptr rp;

  un = GMP_ABS (u->_mp_size);
  if (un == 0)
    {
      r->_mp_size = 0;
      return;
    }

  limbs = bits / GMP_LIMB_BITS;
  shift = bits % GMP_LIMB_BITS;

  rn = un + limbs + (shift > 0);
  rp = MPZ_REALLOC (r, rn);
  if (shift > 0)
    {
      mp_limb_t cy = mpn_lshift (rp + limbs, u->_mp_d, un, shift);
      rp[rn-1] = cy;
      rn -= (cy == 0);
    }
  else
    mpn_copyd (rp + limbs, u->_mp_d, un);

  mpn_zero (rp, limbs);

  r->_mp_size = (u->_mp_size < 0) ? - rn : rn;
}